

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerSocket.cpp
# Opt level: O3

void __thiscall cplus::socket::SocketServer::SocketServer(SocketServer *this,uint16_t port)

{
  int iVar1;
  Exception *this_00;
  ServerException *this_01;
  socklen_t in_ECX;
  sockaddr *in_RDX;
  undefined6 in_register_00000032;
  string local_c0;
  String local_a0;
  string local_88;
  String local_68;
  String local_50;
  Long local_38;
  
  (this->super_Object)._vptr_Object = (_func_int **)&PTR_toString_00124230;
  (this->server_addr).sin_family = 0;
  (this->server_addr).sin_port = 0;
  (this->server_addr).sin_addr = 0;
  (this->server_addr).sin_zero[0] = '\0';
  (this->server_addr).sin_zero[1] = '\0';
  (this->server_addr).sin_zero[2] = '\0';
  (this->server_addr).sin_zero[3] = '\0';
  (this->server_addr).sin_zero[4] = '\0';
  (this->server_addr).sin_zero[5] = '\0';
  (this->server_addr).sin_zero[6] = '\0';
  (this->server_addr).sin_zero[7] = '\0';
  this->server_socket = 0;
  this->lengthOfListenQueue = 0x14;
  iVar1 = bind(this,(int)CONCAT62(in_register_00000032,port),in_RDX,in_ECX);
  if (iVar1 != 0) {
    this_00 = (Exception *)__cxa_allocate_exception(0x838);
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Server Bind Port : ","");
    local_38.value = (int64_t)port;
    local_38.super_Object._vptr_Object = (_func_int **)&PTR_toString_001245e8;
    lang::Long::toString(&local_a0,&local_38);
    lang::operator+(&local_68,&local_c0,&local_a0);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88," Failed!","");
    lang::String::operator+(&local_50,&local_68,&local_88);
    system::Exception::Exception(this_00,&local_50);
    (this_00->super_Object)._vptr_Object = (_func_int **)&PTR_toString_00124b18;
    *(undefined ***)&this_00->super_exception = &PTR__ServerException_00124b48;
    __cxa_throw(this_00,&ServerException::typeinfo,system::Exception::~Exception);
  }
  iVar1 = ::listen(this->server_socket,this->lengthOfListenQueue);
  if (iVar1 == 0) {
    return;
  }
  this_01 = (ServerException *)__cxa_allocate_exception(0x838);
  ServerException::ServerException(this_01,"Server Listen Failed!");
  __cxa_throw(this_01,&ServerException::typeinfo,system::Exception::~Exception);
}

Assistant:

SocketServer::SocketServer(uint16_t port) {
			//把socket和socket地址结构联系起来
			if (bind(port)) {
				throw ServerException("Server Bind Port : " + lang::Long(port).toString() + " Failed!");
			}
			//server_socket用于监听
			if (listen()) {
				throw ServerException("Server Listen Failed!");
			}
		}